

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaRead.c
# Opt level: O2

void Pla_ReadAddBody(Pla_Man_t *p,Vec_Str_t *vLits)

{
  int i;
  int iVar1;
  char cVar2;
  uint nSize;
  word *pwVar3;
  word *pwVar4;
  int iVar5;
  word Fill;
  word Fill_00;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  
  iVar5 = p->nOuts + p->nIns;
  uVar7 = (long)vLits->nSize / (long)iVar5;
  if (vLits->nSize % iVar5 != 0) {
    __assert_fail("Vec_StrSize(vLits) % (p->nIns + p->nOuts) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaRead.c"
                  ,0xa2,"void Pla_ReadAddBody(Pla_Man_t *, Vec_Str_t *)");
  }
  nSize = (uint)uVar7;
  uVar8 = (p->vCubes).nSize;
  if (nSize != uVar8) {
    printf("Warning: Declared number of cubes (%d) differs from the actual (%d).\n",(ulong)uVar8,
           uVar7 & 0xffffffff);
    iVar5 = (p->vCubes).nSize;
    if ((int)nSize < iVar5) {
      (p->vCubes).nSize = nSize;
    }
    else {
      if ((int)nSize <= iVar5) {
        __assert_fail("nCubesReal > Pla_ManCubeNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaRead.c"
                      ,0xab,"void Pla_ReadAddBody(Pla_Man_t *, Vec_Str_t *)");
      }
      Vec_IntFillNatural(&p->vCubes,nSize);
      Vec_WrdFillExtra(&p->vInBits,p->nInWords * nSize,Fill);
      Vec_WrdFillExtra(&p->vOutBits,p->nOutWords * nSize,Fill_00);
    }
  }
  iVar5 = 0;
  for (iVar9 = 0; iVar9 < (p->vCubes).nSize; iVar9 = iVar9 + 1) {
    pwVar3 = Vec_WrdEntryP(&p->vInBits,p->nInWords * iVar9);
    pwVar4 = Vec_WrdEntryP(&p->vOutBits,p->nOutWords * iVar9);
    bVar6 = 0;
    for (uVar8 = 0; i = uVar8 + iVar5, (int)uVar8 < p->nIns; uVar8 = uVar8 + 1) {
      cVar2 = Vec_StrEntry(vLits,i);
      pwVar3[uVar8 >> 5] = pwVar3[uVar8 >> 5] | (ulong)(uint)(int)cVar2 << (bVar6 & 0x3e);
      bVar6 = bVar6 + 2;
    }
    bVar6 = 0;
    uVar7 = 0;
    while( true ) {
      iVar1 = (int)uVar7;
      iVar5 = i + iVar1;
      if (p->nOuts <= iVar1) break;
      cVar2 = Vec_StrEntry(vLits,iVar5);
      pwVar4[uVar7 >> 5] = pwVar4[uVar7 >> 5] | (ulong)(uint)(int)cVar2 << (bVar6 & 0x3e);
      uVar7 = (ulong)(iVar1 + 1);
      bVar6 = bVar6 + 2;
    }
  }
  if (iVar5 == vLits->nSize) {
    return;
  }
  __assert_fail("Count == Vec_StrSize(vLits)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaRead.c"
                ,0xb8,"void Pla_ReadAddBody(Pla_Man_t *, Vec_Str_t *)");
}

Assistant:

void Pla_ReadAddBody( Pla_Man_t * p, Vec_Str_t * vLits )
{
    word * pCubeIn, * pCubeOut; 
    int i, k, Lit, Count = 0; 
    int nCubesReal = Vec_StrSize(vLits) / (p->nIns + p->nOuts);
    assert( Vec_StrSize(vLits) % (p->nIns + p->nOuts) == 0 );
    if ( nCubesReal != Pla_ManCubeNum(p) )
    {
        printf( "Warning: Declared number of cubes (%d) differs from the actual (%d).\n", 
            Pla_ManCubeNum(p), nCubesReal );
        if ( nCubesReal < Pla_ManCubeNum(p) )
            Vec_IntShrink( &p->vCubes, nCubesReal );
        else
        {
            assert( nCubesReal > Pla_ManCubeNum(p) );
            Vec_IntFillNatural( &p->vCubes, nCubesReal );
            Vec_WrdFillExtra( &p->vInBits,  nCubesReal * p->nInWords,  0 );
            Vec_WrdFillExtra( &p->vOutBits, nCubesReal * p->nOutWords, 0 );
        }
    }
    Pla_ForEachCubeInOut( p, pCubeIn, pCubeOut, i )
    {
        Pla_CubeForEachLit( p->nIns, pCubeIn, Lit, k )
            Pla_CubeSetLit( pCubeIn, k, (Pla_Lit_t)Vec_StrEntry(vLits, Count++) );
        Pla_CubeForEachLit( p->nOuts, pCubeOut, Lit, k )
            Pla_CubeSetLit( pCubeOut, k, (Pla_Lit_t)Vec_StrEntry(vLits, Count++) );
    }
    assert( Count == Vec_StrSize(vLits) );
}